

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::consume(Buffer *this,size_t consumedBytes)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  allocator_type local_29;
  vector<char,std::allocator<char>> local_28 [24];
  
  pcVar1 = (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if ((ulong)((long)__last._M_current - (long)pcVar1) < consumedBytes) {
    if (__last._M_current != pcVar1) {
      (this->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar1;
    }
  }
  else {
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              (local_28,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                        (pcVar1 + consumedBytes),__last,&local_29);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->data,local_28);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)local_28);
  }
  return;
}

Assistant:

void Buffer::consume(std::size_t consumedBytes) {
    if(consumedBytes > data.size()){
        data.clear();
    }
    else{
        data = std::vector<char>(data.begin() + consumedBytes, data.end());
    }
}